

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void example1(string *fileName)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  vector<int,_std::allocator<int>_> *corY_00;
  void *__buf;
  gdsSTR local_538;
  gdsBOUNDARY local_440;
  int local_3d8 [12];
  iterator local_3a8;
  undefined8 local_3a0;
  int local_398 [12];
  iterator local_368;
  undefined8 local_360;
  gdsPATH local_358;
  int local_2e8 [2];
  iterator local_2e0;
  undefined8 local_2d8;
  int local_2d0 [2];
  iterator local_2c8;
  undefined8 local_2c0;
  gdsPATH local_2b8;
  int local_244 [3];
  iterator local_238;
  undefined8 local_230;
  int local_224 [3];
  iterator local_218;
  undefined8 local_210;
  undefined1 local_208 [8];
  vector<int,_std::allocator<int>_> corY;
  vector<int,_std::allocator<int>_> corX;
  undefined1 local_1c8 [8];
  gdsSTR fooSTR;
  gdscpp fooGDS;
  string *fileName_local;
  
  gdscpp::gdscpp((gdscpp *)
                 &fooSTR.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  gdsSTR::gdsSTR((gdsSTR *)local_1c8);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_208);
  std::__cxx11::string::operator=((string *)local_1c8,"arrow_box");
  local_224[0] = 0;
  local_224[1] = 200;
  local_224[2] = 400;
  local_218 = local_224;
  local_210 = 3;
  __l_04._M_len = 3;
  __l_04._M_array = local_218;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             &corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__l_04);
  local_244[0] = 700;
  local_244[1] = 900;
  local_244[2] = 700;
  local_238 = local_244;
  local_230 = 3;
  __l_03._M_len = 3;
  __l_03._M_array = local_238;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)local_208,__l_03);
  drawPath(&local_2b8,1,5,
           (vector<int,_std::allocator<int>_> *)
           &corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_208);
  std::vector<gdsPATH,_std::allocator<gdsPATH>_>::push_back
            ((vector<gdsPATH,_std::allocator<gdsPATH>_> *)
             &fooSTR.BOUNDARY.super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_2b8);
  gdsPATH::~gdsPATH(&local_2b8);
  local_2d0[0] = 200;
  local_2d0[1] = 200;
  local_2c8 = local_2d0;
  local_2c0 = 2;
  __l_02._M_len = 2;
  __l_02._M_array = local_2c8;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             &corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__l_02);
  local_2e8[0] = 900;
  local_2e8[1] = 0;
  local_2e0 = local_2e8;
  local_2d8 = 2;
  __l_01._M_len = 2;
  __l_01._M_array = local_2e0;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)local_208,__l_01);
  drawPath(&local_358,1,5,
           (vector<int,_std::allocator<int>_> *)
           &corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_208);
  std::vector<gdsPATH,_std::allocator<gdsPATH>_>::push_back
            ((vector<gdsPATH,_std::allocator<gdsPATH>_> *)
             &fooSTR.BOUNDARY.super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_358);
  gdsPATH::~gdsPATH(&local_358);
  local_398[8] = 400;
  local_398[9] = 0;
  local_398[10] = 0;
  local_398[4] = 0xfa;
  local_398[5] = 0x96;
  local_398[6] = 0x96;
  local_398[7] = 400;
  local_398[0] = 0;
  local_398[1] = 0x96;
  local_398[2] = 0x96;
  local_398[3] = 0xfa;
  local_368 = local_398;
  local_360 = 0xb;
  __l_00._M_len = 0xb;
  __l_00._M_array = local_368;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             &corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__l_00);
  local_3d8[8] = 400;
  local_3d8[9] = 400;
  local_3d8[10] = 0;
  local_3d8[4] = 0x96;
  local_3d8[5] = 0x96;
  local_3d8[6] = 0;
  local_3d8[7] = 0;
  local_3d8[0] = 0;
  local_3d8[1] = 0;
  local_3d8[2] = 0xfa;
  local_3d8[3] = 0xfa;
  local_3a8 = local_3d8;
  local_3a0 = 0xb;
  __l._M_len = 0xb;
  __l._M_array = local_3a8;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)local_208,__l);
  corY_00 = (vector<int,_std::allocator<int>_> *)local_208;
  drawBoundary(&local_440,2,
               (vector<int,_std::allocator<int>_> *)
               &corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,corY_00);
  std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::push_back
            ((vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_> *)
             &fooSTR.last_modified.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_440);
  gdsBOUNDARY::~gdsBOUNDARY(&local_440);
  gdsSTR::gdsSTR(&local_538,(gdsSTR *)local_1c8);
  gdscpp::setSTR((gdscpp *)
                 &fooSTR.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_538);
  gdsSTR::~gdsSTR(&local_538);
  gdscpp::write((gdscpp *)
                &fooSTR.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(int)fileName,__buf,(size_t)corY_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_208);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  gdsSTR::~gdsSTR((gdsSTR *)local_1c8);
  gdscpp::~gdscpp((gdscpp *)
                  &fooSTR.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void example1(const string &fileName)
{
  gdscpp fooGDS;
  gdsSTR fooSTR;

  vector<int> corX;
  vector<int> corY;

  fooSTR.name = "arrow_box";

  corX = {000, 200, 400};
  corY = {700, 900, 700};
  fooSTR.PATH.push_back(drawPath(1, 5, corX, corY));

  corX = {200, 200};
  corY = {900, 000};
  fooSTR.PATH.push_back(drawPath(1, 5, corX, corY));

  corX = {0, 150, 150, 250, 250, 150, 150, 400, 400, 000, 0};
  corY = {0, 000, 250, 250, 150, 150, 000, 000, 400, 400, 0};
  fooSTR.BOUNDARY.push_back(drawBoundary(2, corX, corY));

  fooGDS.setSTR(fooSTR);
  fooGDS.write(fileName);
}